

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

bool __thiscall
HVectorBase<HighsCDouble>::isEqual(HVectorBase<HighsCDouble> *this,HVectorBase<HighsCDouble> *v0)

{
  bool bVar1;
  
  if (this->size != v0->size) {
    return false;
  }
  if (((this->count == v0->count) && (bVar1 = std::operator!=(&this->index,&v0->index), !bVar1)) &&
     (bVar1 = std::operator!=(&this->array,&v0->array), !bVar1)) {
    return (bool)(-(v0->synthetic_tick == this->synthetic_tick) & 1);
  }
  return false;
}

Assistant:

bool HVectorBase<Real>::isEqual(const HVectorBase<Real>& v0) {
  if (this->size != v0.size) return false;
  if (this->count != v0.count) return false;
  if (this->index != v0.index) return false;
  if (this->array != v0.array) return false;
  //  if (this->index.size() != v0.index.size()) return false;
  //  for (HighsInt el = 0; el < (HighsInt)this->index.size(); el++)
  //    if (this->index[el] != v0.index[el]) return false;
  if (this->synthetic_tick != v0.synthetic_tick) return false;
  return true;
}